

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O0

void __thiscall
UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
          (reverse_lock *this,UniqueLock<AnnotatedMixin<std::mutex>_> *_lock,char *_guardname,
          char *_file,int _line)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  unique_lock<std::mutex> *in_stack_ffffffffffffff80;
  unique_lock<std::mutex> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  this_00 = (unique_lock<std::mutex> *)(in_RDI + 1);
  UniqueLock((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 3);
  std::__cxx11::string::string(this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_R8D,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  std::allocator<char>::~allocator(&local_9);
  *(undefined4 *)(in_RDI + 0xb) = in_R8D;
  std::unique_lock<std::mutex>::mutex
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  CheckLastCritical(in_RDI,this_01,(char *)this_00,(char *)in_stack_ffffffffffffff80,
                    in_stack_ffffffffffffff7c);
  std::unique_lock<std::mutex>::unlock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  LeaveCritical();
  std::unique_lock<std::mutex>::swap(this_00,in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit reverse_lock(UniqueLock& _lock, const char* _guardname, const char* _file, int _line) : lock(_lock), file(_file), line(_line) {
            CheckLastCritical((void*)lock.mutex(), lockname, _guardname, _file, _line);
            lock.unlock();
            LeaveCritical();
            lock.swap(templock);
        }